

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

bool __thiscall libcellml::XmlNode::isInteger(XmlNode *this)

{
  bool bVar1;
  int dummyInt;
  int local_2c;
  string local_28;
  
  convertToStrippedString_abi_cxx11_(&local_28,this);
  bVar1 = convertToInt(&local_28,&local_2c);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool XmlNode::isInteger() const
{
    int dummyInt;
    return convertToInt(convertToStrippedString(), dummyInt);
}